

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdata.cpp
# Opt level: O2

int32_t __thiscall icu_63::CollationData::getScriptIndex(CollationData *this,int32_t script)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  if (-1 < script) {
    if (script < this->numScripts) {
      uVar2 = (ulong)(uint)script;
    }
    else {
      if ((script & 0x7ffffff8U) != 0x1000) {
        return 0;
      }
      uVar2 = (ulong)(script + this->numScripts + -0x1000);
    }
    uVar1 = (uint)this->scriptsIndex[uVar2];
  }
  return uVar1;
}

Assistant:

int32_t
CollationData::getScriptIndex(int32_t script) const {
    if(script < 0) {
        return 0;
    } else if(script < numScripts) {
        return scriptsIndex[script];
    } else if(script < UCOL_REORDER_CODE_FIRST) {
        return 0;
    } else {
        script -= UCOL_REORDER_CODE_FIRST;
        if(script < MAX_NUM_SPECIAL_REORDER_CODES) {
            return scriptsIndex[numScripts + script];
        } else {
            return 0;
        }
    }
}